

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void yang_free_nodes(ly_ctx *ctx,lys_node *node)

{
  LYS_NODE LVar1;
  lys_node *node_00;
  lys_node *plVar2;
  lys_node *sibling;
  lys_node *child;
  lys_node *tmp;
  lys_node *node_local;
  ly_ctx *ctx_local;
  
  child = node;
  if (node != (lys_node *)0x0) {
    while (child != (lys_node *)0x0) {
      node_00 = child->child;
      plVar2 = child->next;
      lydict_remove(ctx,child->name);
      if ((child->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
        lys_iffeature_free(ctx,child->iffeature,child->iffeature_size,0,
                           (_func_void_lys_node_ptr_void_ptr *)0x0);
        lydict_remove(ctx,child->dsc);
        lydict_remove(ctx,child->ref);
      }
      LVar1 = child->nodetype;
      if (LVar1 == LYS_CONTAINER) {
        yang_free_container(ctx,(lys_node_container *)child);
      }
      else if (LVar1 == LYS_CHOICE) {
        yang_free_choice(ctx,(lys_node_choice *)child);
      }
      else if (LVar1 == LYS_LEAF) {
        yang_free_leaf(ctx,(lys_node_leaf *)child);
      }
      else if (LVar1 == LYS_LEAFLIST) {
        yang_free_leaflist(ctx,(lys_node_leaflist *)child);
      }
      else if (LVar1 == LYS_LIST) {
        yang_free_list(ctx,(lys_node_list *)child);
      }
      else if (LVar1 == LYS_ANYXML) {
LAB_00181890:
        yang_free_anydata(ctx,(lys_node_anydata *)child);
      }
      else if (LVar1 == LYS_CASE) {
        lys_when_free(ctx,*(lys_when **)child->hash,(_func_void_lys_node_ptr_void_ptr *)0x0);
      }
      else if (LVar1 == LYS_NOTIF) {
        yang_free_notif(ctx,(lys_node_notif *)child);
      }
      else if (LVar1 == LYS_RPC) {
LAB_00181816:
        yang_free_grouping(ctx,(lys_node_grp *)child);
      }
      else if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) {
        yang_free_inout(ctx,(lys_node_inout *)child);
      }
      else {
        if (LVar1 == LYS_GROUPING) goto LAB_00181816;
        if (LVar1 == LYS_USES) {
          yang_free_uses(ctx,(lys_node_uses *)child);
        }
        else {
          if (LVar1 == LYS_ACTION) goto LAB_00181816;
          if (LVar1 == LYS_ANYDATA) goto LAB_00181890;
        }
      }
      lys_extension_instances_free
                (ctx,child->ext,(uint)child->ext_size,(_func_void_lys_node_ptr_void_ptr *)0x0);
      yang_free_nodes(ctx,node_00);
      free(child);
      child = plVar2;
    }
  }
  return;
}

Assistant:

static void
yang_free_nodes(struct ly_ctx *ctx, struct lys_node *node)
{
    struct lys_node *tmp, *child, *sibling;

    if (!node) {
        return;
    }
    tmp = node;

    while (tmp) {
        child = tmp->child;
        sibling = tmp->next;
        /* common part */
        lydict_remove(ctx, tmp->name);
        if (!(tmp->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            lys_iffeature_free(ctx, tmp->iffeature, tmp->iffeature_size, 0, NULL);
            lydict_remove(ctx, tmp->dsc);
            lydict_remove(ctx, tmp->ref);
        }

        switch (tmp->nodetype) {
        case LYS_GROUPING:
        case LYS_RPC:
        case LYS_ACTION:
            yang_free_grouping(ctx, (struct lys_node_grp *)tmp);
            break;
        case LYS_CONTAINER:
            yang_free_container(ctx, (struct lys_node_container *)tmp);
            break;
        case LYS_LEAF:
            yang_free_leaf(ctx, (struct lys_node_leaf *)tmp);
            break;
        case LYS_LEAFLIST:
            yang_free_leaflist(ctx, (struct lys_node_leaflist *)tmp);
            break;
        case LYS_LIST:
            yang_free_list(ctx, (struct lys_node_list *)tmp);
            break;
        case LYS_CHOICE:
            yang_free_choice(ctx, (struct lys_node_choice *)tmp);
            break;
        case LYS_CASE:
            lys_when_free(ctx, ((struct lys_node_case *)tmp)->when, NULL);
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            yang_free_anydata(ctx, (struct lys_node_anydata *)tmp);
            break;
        case LYS_INPUT:
        case LYS_OUTPUT:
            yang_free_inout(ctx, (struct lys_node_inout *)tmp);
            break;
        case LYS_NOTIF:
            yang_free_notif(ctx, (struct lys_node_notif *)tmp);
            break;
        case LYS_USES:
            yang_free_uses(ctx, (struct lys_node_uses *)tmp);
            break;
        default:
            break;
        }
        lys_extension_instances_free(ctx, tmp->ext, tmp->ext_size, NULL);
        yang_free_nodes(ctx, child);
        free(tmp);
        tmp = sibling;
    }
}